

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  KNearestNeighborsClassifier *this;
  bool bVar1;
  WeightingSchemeCase WVar2;
  DefaultClassLabelCase DVar3;
  Int64Parameter *int64Parameter;
  Int64Vector *this_00;
  StringVector *this_01;
  ostream *poVar4;
  KNearestNeighborsClassifier *model;
  undefined1 in_R9B;
  ClassLabelsCase local_7c4;
  ClassLabelsCase local_7c0;
  int local_7a8;
  undefined1 local_760 [72];
  stringstream local_718 [8];
  stringstream out_3;
  ostream local_708 [376];
  string local_590;
  stringstream out_2;
  ostream local_560 [376];
  string local_3e8;
  stringstream out_1;
  ostream local_3b8 [383];
  byte local_239;
  ClassLabelsCase local_238;
  ClassLabelsCase CStack_234;
  bool defaultClassLabelIsInt64;
  ClassLabelsCase classLabelCase;
  int labelCount;
  int stringLabelCount;
  int intLabelCount;
  stringstream local_208 [8];
  stringstream out;
  ostream local_1f8 [376];
  undefined4 local_80;
  allocator local_69;
  string_conflict local_68;
  Result local_48;
  KNearestNeighborsClassifier *knnClassifier;
  Model *format_local;
  
  knnClassifier = (KNearestNeighborsClassifier *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_48.m_message._M_storage._M_storage =
       (uchar  [8])Specification::Model::knearestneighborsclassifier(format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"numberOfNeighbors",&local_69);
  int64Parameter =
       Specification::KNearestNeighborsClassifier::numberofneighbors
                 ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage);
  validateInt64Parameter(&local_48,&local_68,int64Parameter,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = Result::good(&local_48);
  if (bVar1) {
    WVar2 = Specification::KNearestNeighborsClassifier::WeightingScheme_case
                      ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage);
    if (WVar2 == WEIGHTINGSCHEME_NOT_SET) {
      std::__cxx11::stringstream::stringstream(local_208);
      poVar4 = std::operator<<(local_1f8,
                               "KNearestNeighborsClassifier requires a weighting scheme to be set.")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&stringLabelCount);
      std::__cxx11::string::~string((string *)&stringLabelCount);
      local_80 = 1;
      std::__cxx11::stringstream::~stringstream(local_208);
    }
    else {
      bVar1 = Specification::KNearestNeighborsClassifier::has_int64classlabels
                        ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage);
      if (bVar1) {
        this_00 = Specification::KNearestNeighborsClassifier::int64classlabels
                            ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage
                            );
        local_7a8 = Specification::Int64Vector::vector_size(this_00);
      }
      else {
        local_7a8 = 0;
      }
      labelCount = local_7a8;
      bVar1 = Specification::KNearestNeighborsClassifier::has_stringclasslabels
                        ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage);
      if (bVar1) {
        this_01 = Specification::KNearestNeighborsClassifier::stringclasslabels
                            ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage
                            );
        local_7c0 = Specification::StringVector::vector_size(this_01);
      }
      else {
        local_7c0 = CLASSLABELS_NOT_SET;
      }
      classLabelCase = local_7c0;
      if ((int)local_7c0 < labelCount) {
        local_7c4 = labelCount;
      }
      else {
        local_7c4 = local_7c0;
      }
      CStack_234 = local_7c4;
      local_238 = Specification::KNearestNeighborsClassifier::ClassLabels_case
                            ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage
                            );
      local_239 = 0;
      DVar3 = Specification::KNearestNeighborsClassifier::DefaultClassLabel_case
                        ((KNearestNeighborsClassifier *)local_48.m_message._M_storage._M_storage);
      this = knnClassifier;
      if (DVar3 == DEFAULTCLASSLABEL_NOT_SET) {
        if (CStack_234 == CLASSLABELS_NOT_SET) {
          std::__cxx11::stringstream::stringstream(local_718);
          poVar4 = std::operator<<(local_708,
                                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                         (string *)(local_760 + 0x28));
          std::__cxx11::string::~string((string *)(local_760 + 0x28));
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream(local_718);
          goto LAB_0036e947;
        }
      }
      else if (DVar3 == kDefaultStringLabel) {
        if ((local_238 != CLASSLABELS_NOT_SET) && (local_238 != kStringClassLabels)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_3e8._M_storage);
          poVar4 = std::operator<<(local_3b8,
                                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_3e8._M_storage);
          goto LAB_0036e947;
        }
        local_239 = 0;
      }
      else if (DVar3 == kDefaultInt64Label) {
        if ((local_238 != CLASSLABELS_NOT_SET) && (local_238 != kInt64ClassLabels)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_590._M_storage);
          poVar4 = std::operator<<(local_560,
                                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_590);
          std::__cxx11::string::~string((string *)&local_590);
          local_80 = 1;
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_590._M_storage);
          goto LAB_0036e947;
        }
        local_239 = 1;
      }
      model = Specification::Model::knearestneighborsclassifier((Model *)knnClassifier);
      validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                ((Result *)local_760,(CoreML *)this,(Model *)model,
                 (KNearestNeighborsClassifier *)0x1,(bool)(local_239 & 1),(bool)in_R9B);
      Result::operator=(&local_48,(Result *)local_760);
      Result::~Result((Result *)local_760);
      bVar1 = Result::good(&local_48);
      if (bVar1) {
        validateNearestNeighborsIndex(__return_storage_ptr__,(Model *)knnClassifier,CStack_234);
        local_80 = 1;
      }
      else {
        Result::Result(__return_storage_ptr__,&local_48);
        local_80 = 1;
      }
    }
  }
  else {
    Result::Result(__return_storage_ptr__,&local_48);
    local_80 = 1;
  }
LAB_0036e947:
  Result::~Result(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }
        
        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;
        
        int labelCount = MAX(intLabelCount, stringLabelCount);
        
        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;
        
        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;
                    
            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;
                
            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }
        
        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }

        
        return validateNearestNeighborsIndex(format, labelCount);

    }